

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

Matrix3d *
RigidBodyDynamics::Body::TransformInertiaToBodyFrame(SpatialTransform *transform,Body *initial_body)

{
  ConstTransposeReturnType this;
  MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_RDI;
  Matrix3d inertia_initial_com_rotated;
  Matrix3d inertia_initial_com;
  Matrix3d initial_com_cross;
  Matrix3d inertia_initial;
  SpatialRigidBodyInertia initial_rbi;
  Vector3d initial_com;
  Matrix3d *inertia_initial_com_rotated_this_origin;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffffbe8;
  MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *other;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc08 [16];
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *other_00;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffc18;
  StorageBaseType *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc38;
  Vector3d *in_stack_fffffffffffffc50;
  Vector3d *in_stack_fffffffffffffce8;
  Scalar in_stack_fffffffffffffcf0;
  Matrix3d *in_stack_fffffffffffffcf8;
  Matrix3d *in_stack_fffffffffffffd68;
  Vector3d *in_stack_fffffffffffffd70;
  Scalar in_stack_fffffffffffffd78;
  SpatialRigidBodyInertia *in_stack_fffffffffffffd98;
  
  other = in_RDI;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffbe8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
            (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffbe8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc08._8_8_);
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Vector3_t *)in_RDI,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffbe8);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffffd98);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_fffffffffffffc00,
             (Index)other,(Index)in_RDI);
  Matrix3_t::Matrix3_t<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
            ((Matrix3_t *)in_RDI,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
             in_stack_fffffffffffffbe8);
  Math::VectorCrossMatrix(in_stack_fffffffffffffc50);
  Eigen::operator*(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffbe8);
  other_00 = in_stack_fffffffffffffc08._8_8_;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(in_stack_fffffffffffffc08._0_8_,in_stack_fffffffffffffc00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-(in_stack_fffffffffffffc18,other_00);
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            ((Matrix3_t *)in_RDI,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)in_stack_fffffffffffffbe8);
  this = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                   ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffbe8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
            (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffbe8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this.m_matrix,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix3_t *)in_RDI,in_stack_fffffffffffffbe8);
  Math::parallel_axis(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8)
  ;
  return (Matrix3d *)(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other;
}

Assistant:

static Math::Matrix3d TransformInertiaToBodyFrame(const Math::SpatialTransform &transform,
                                                    const Body &initial_body)
  {
    Math::Vector3d initial_com = transform.E.transpose() * initial_body.mCenterOfMass +
                               transform.r;

    Math::SpatialRigidBodyInertia initial_rbi =
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC (initial_body.mMass,
          initial_body.mCenterOfMass, initial_body.mInertia);

    Math::Matrix3d inertia_initial = initial_rbi.toMatrix().block<3,3>(0,0);
    LOG << "inertia_initial = " << std::endl << inertia_initial << std::endl;

    // 1. Transform the inertia from initial origin to initial COM
    Math::Matrix3d initial_com_cross = Math::VectorCrossMatrix(
                                       initial_body.mCenterOfMass);
    Math::Matrix3d inertia_initial_com = inertia_initial - initial_body.mMass * initial_com_cross
                                       * initial_com_cross.transpose();
    LOG << "inertia_initial_com = " << std::endl << inertia_initial_com << std::endl;

    // 2. Rotate the inertia that it is aligned to the frame of this body
    Math::Matrix3d inertia_initial_com_rotated = transform.E.transpose() *
        inertia_initial_com * transform.E;
    LOG << "inertia_initial_com_rotated = " << std::endl << inertia_initial_com_rotated
        << std::endl;

    // 3. Transform inertia of initial_body to the origin of the frame of the target body
    Math::Matrix3d inertia_initial_com_rotated_this_origin = Math::parallel_axis (
          inertia_initial_com_rotated, initial_body.mMass, initial_com);
    LOG << "inertia_initial_com_rotated_this_origin = " << std::endl <<
        inertia_initial_com_rotated_this_origin << std::endl;
    return inertia_initial_com_rotated_this_origin;
  }